

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setEnclosingElementName
          (XMLSchemaDescriptionImpl *this,QName *encElement)

{
  QName *this_00;
  
  if (this->fEnclosingElementName != (QName *)0x0) {
    (*(this->fEnclosingElementName->super_XSerializable)._vptr_XSerializable[1])();
    this->fEnclosingElementName = (QName *)0x0;
  }
  this_00 = (QName *)XMemory::operator_new(0x48,encElement->fMemoryManager);
  QName::QName(this_00,encElement);
  this->fEnclosingElementName = this_00;
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setEnclosingElementName(QName* const encElement)
{ 
    if (fEnclosingElementName) {
        delete fEnclosingElementName;
        fEnclosingElementName = 0; 
    }

    fEnclosingElementName = new (encElement->getMemoryManager()) QName(*encElement); 

}